

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasisPolynomial.cpp
# Opt level: O0

void __thiscall
BasisPolynomial::BasisPolynomial(BasisPolynomial *this,vector<int,_std::allocator<int>_> *data)

{
  vector<int,_std::allocator<int>_> *data_local;
  BasisPolynomial *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->data_points);
  std::vector<int,_std::allocator<int>_>::operator=(&this->data_points,data);
  return;
}

Assistant:

BasisPolynomial::BasisPolynomial(vector<int> data) { // constructor
    BasisPolynomial::data_points = data;
}